

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O3

void __thiscall
tchecker::algorithms::couvscc::
generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::merge_scc
          (generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
           *this,node_sptr_t *n,stats_t *stats,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels)

{
  ulong uVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  uint uVar2;
  _Elt_pointer prVar3;
  node_t *pnVar4;
  pointer puVar5;
  bool bVar6;
  ulong uVar7;
  uint *puVar8;
  bool *pbVar9;
  underflow_error *this_01;
  overflow_error *this_02;
  _Elt_pointer prVar10;
  make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
  *pmVar11;
  long lVar12;
  code *pcVar13;
  _Elt_pointer prVar14;
  ulong uVar15;
  undefined *puVar16;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> scc_labels;
  undefined1 local_88 [32];
  size_type local_68;
  size_type local_60;
  roots_stack_entry_t local_58;
  
  this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)(local_88 + 0x10);
  local_88._8_8_ = stats;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (this_00,labels->m_num_bits,0,(allocator<unsigned_long> *)&local_58);
  local_88._0_8_ = (node_t *)0x0;
  do {
    prVar14 = (this->_roots).c.
              super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    prVar3 = (this->_roots).c.
             super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    prVar10 = prVar14;
    if (prVar14 == prVar3) {
      prVar10 = (this->_roots).c.
                super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
    }
    pnVar4 = (node_t *)local_88._0_8_;
    if ((_Elt_pointer)local_88 != prVar10 + -1) {
      pnVar4 = (node_t *)prVar10[-1].n._t;
      if ((pnVar4 != (node_t *)0x0) &&
         (lVar12 = *(long *)&pnVar4[-1]._dfsnum + 1, *(long *)&pnVar4[-1]._dfsnum = lVar12,
         lVar12 == -2)) {
        this_01 = (underflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error((overflow_error *)this_01,"reference counter overflow");
        pcVar13 = std::overflow_error::~overflow_error;
        puVar16 = &std::overflow_error::typeinfo;
LAB_0012b8f0:
        __cxa_throw(this_01,puVar16,pcVar13);
      }
      if ((node_t *)local_88._0_8_ != (node_t *)0x0) {
        pmVar11 = (((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                     *)((bool *)(local_88._0_8_ + -0x28) + 0x20))->_head)._t;
        if (pmVar11 ==
            (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
             *)0x0) {
          this_01 = (underflow_error *)__cxa_allocate_exception(0x10);
          std::underflow_error::underflow_error(this_01,"reference counter underflow");
          pcVar13 = std::underflow_error::~underflow_error;
          puVar16 = &std::underflow_error::typeinfo;
          goto LAB_0012b8f0;
        }
        (((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
           *)((bool *)(local_88._0_8_ + -0x28) + 0x20))->_head)._t =
             (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
              *)((long)&pmVar11[-1].
                        super_edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                        .
                        super_edge_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                        .
                        super_edge_node_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                        ._node._t + 7);
      }
    }
    local_88._0_8_ = pnVar4;
    if (prVar14 == prVar3) {
      prVar14 = (this->_roots).c.
                super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator|=
              (this_00,&prVar14[-1].labels);
    puVar5 = (labels->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar12 = (long)(labels->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar5;
    if (lVar12 != 0) {
      uVar7 = lVar12 >> 3;
      if (*puVar5 == 0) {
        uVar15 = 0;
        do {
          if ((uVar7 + (uVar7 == 0)) - 1 == uVar15) goto LAB_0012b757;
          uVar1 = uVar15 + 1;
          lVar12 = uVar15 + 1;
          uVar15 = uVar1;
        } while (puVar5[lVar12] == 0);
        if (uVar7 <= uVar1) goto LAB_0012b757;
      }
      bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                        (labels,this_00);
      if (bVar6) {
        pbVar9 = stats_t::cycle((stats_t *)local_88._8_8_);
        *pbVar9 = true;
        goto LAB_0012b83b;
      }
    }
LAB_0012b757:
    std::
    deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
    ::pop_back(&(this->_roots).c);
    if ((node_t *)local_88._0_8_ == (node_t *)0x0) {
LAB_0012b87b:
      __assert_fail("_t != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                    ,0x1db,
                    "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
                   );
    }
    puVar8 = couvscc::node_t::dfsnum((node_t *)local_88._0_8_);
    if ((node_t *)n->_t == (node_t *)0x0) goto LAB_0012b87b;
    uVar2 = *puVar8;
    puVar8 = couvscc::node_t::dfsnum((node_t *)n->_t);
  } while (*puVar8 < uVar2);
  if (((node_t *)local_88._0_8_ != (node_t *)0x0) &&
     (pmVar11 = (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
                 *)((long)&(((((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
                                *)((bool *)(local_88._0_8_ + -0x28) + 0x20))->_head)._t)->
                           super_edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                           ).super_edge_t.super_edge_vedge_t._vedge._t + 1),
     (((edge_list_t<tchecker::graph::directed::details::outgoing,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>
        *)((bool *)(local_88._0_8_ + -0x28) + 0x20))->_head)._t = pmVar11,
     pmVar11 ==
     (make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
      *)0xfffffffffffffffe)) {
    this_02 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_02,"reference counter overflow");
    __cxa_throw(this_02,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  local_58.n._t =
       (make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
        *)local_88._0_8_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_58.labels.m_bits,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_88 + 0x10));
  local_58.labels.m_num_bits = local_60;
  std::
  deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
  ::
  emplace_back<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>
            ((deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>>
              *)&this->_roots,&local_58);
  bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                    (&local_58.labels);
  if (bVar6) {
    if (local_58.labels.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.labels.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.labels.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.labels.m_bits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_58.n);
LAB_0012b83b:
    intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t
              ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                *)local_88);
    bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_check_invariants
                      ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                       (local_88 + 0x10));
    if (bVar6) {
      if ((pointer)local_88._16_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._16_8_,local_68 - local_88._16_8_);
      }
      return;
    }
  }
  __assert_fail("m_check_invariants()","/usr/include/boost/dynamic_bitset/dynamic_bitset.hpp",0x2be,
                "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
               );
}

Assistant:

void merge_scc(node_sptr_t & n, tchecker::algorithms::couvscc::stats_t & stats, boost::dynamic_bitset<> const & labels)
  {
    boost::dynamic_bitset<> scc_labels{labels.size(), 0};
    node_sptr_t u{nullptr};
    do {
      u = _roots.top().n;
      scc_labels |= _roots.top().labels;
      if (!labels.none() && labels.is_subset_of(scc_labels)) {
        stats.cycle() = true;
        return;
      }
      _roots.pop();
    } while (u->dfsnum() > n->dfsnum());
    _roots.push(roots_stack_entry_t{u, scc_labels});
  }